

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O2

void __thiscall
UnexpectedExceptionFailure::UnexpectedExceptionFailure
          (UnexpectedExceptionFailure *this,UtestShell *test,exception *e)

{
  undefined8 uVar1;
  char *pcVar2;
  int status;
  SimpleString local_60;
  SimpleString local_50;
  unique_ptr<char,_void_(*)(void_*)> local_40;
  int local_2c;
  
  pcVar2 = *(char **)(*(long *)(*(long *)e + -8) + 8);
  pcVar2 = pcVar2 + (*pcVar2 == '*');
  local_2c = -1;
  local_40._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.super__Head_base<0UL,_char_*,_false>._M_head_impl
       = (char *)__cxa_demangle(pcVar2,0,0,&local_2c);
  local_40._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)free;
  if (local_2c == 0) {
    pcVar2 = local_40._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
             super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.super__Head_base<0UL,_char_*,_false>.
             _M_head_impl;
  }
  SimpleString::SimpleString(&local_60,pcVar2);
  std::unique_ptr<char,_void_(*)(void_*)>::~unique_ptr(&local_40);
  pcVar2 = SimpleString::asCharString(&local_60);
  uVar1 = (**(code **)(*(long *)e + 0x10))(e);
  StringFromFormat((char *)&local_50,"Unexpected exception of type \'%s\' was thrown: %s",pcVar2,
                   uVar1);
  TestFailure::TestFailure(&this->super_TestFailure,test,&local_50);
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(&local_60);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__TestFailure_00167d70;
  return;
}

Assistant:

UnexpectedExceptionFailure::UnexpectedExceptionFailure(UtestShell* test, const std::exception &e)
: TestFailure(
    test,
#if CPPUTEST_HAVE_RTTI
    StringFromFormat(
        "Unexpected exception of type '%s' was thrown: %s",
        getExceptionTypeName(e).asCharString(),
        e.what()
    )
#else
    "Unexpected exception of unknown type was thrown."
#endif
)
{
    (void) e;
}